

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O0

void __thiscall
TPZAnalysis::TPZAnalysis
          (TPZAnalysis *this,void **vtt,TPZCompMesh *mesh,bool mustOptimizeBandwidth,ostream *out)

{
  ESolType EVar1;
  TPZCompMesh *in_RDX;
  undefined8 *in_RSI;
  TPZSavable *in_RDI;
  TPZSloanRenumbering *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  TPZCompMesh *in_stack_fffffffffffffee8;
  TPZAnalysis *in_stack_fffffffffffffef0;
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_a0
  ;
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_80
  ;
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_60
  ;
  
  TPZSavable::TPZSavable(in_RDI,(void **)(in_RSI + 1));
  in_RDI->_vptr_TPZSavable = (_func_int **)*in_RSI;
  in_RDI[1]._vptr_TPZSavable = (_func_int **)0x0;
  in_RDI[2]._vptr_TPZSavable = (_func_int **)0x0;
  EVar1 = TPZCompMesh::GetSolType(in_RDX);
  *(ESolType *)&in_RDI[3]._vptr_TPZSavable = EVar1;
  in_RDI[4]._vptr_TPZSavable = (_func_int **)0x0;
  in_RDI[5]._vptr_TPZSavable = (_func_int **)0x0;
  in_RDI[6]._vptr_TPZSavable = (_func_int **)0x0;
  TPZSolutionMatrix::TPZSolutionMatrix
            ((TPZSolutionMatrix *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
             (bool)in_stack_fffffffffffffedf);
  in_RDI[0x2e]._vptr_TPZSavable = (_func_int **)0x0;
  local_60 = (TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(in_RDI + 0x2f);
  do {
    TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::TPZVec
              (local_60);
    local_60 = local_60 + 1;
  } while (local_60 !=
           (TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(in_RDI + 0x3b));
  local_80 = (TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(in_RDI + 0x3b);
  do {
    TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::TPZVec
              (local_80);
    local_80 = local_80 + 1;
  } while (local_80 !=
           (TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(in_RDI + 0x47));
  local_a0 = (TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(in_RDI + 0x47);
  do {
    TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::TPZVec
              (local_a0);
    local_a0 = local_a0 + 1;
  } while (local_a0 !=
           (TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(in_RDI + 0x53));
  *(undefined4 *)&in_RDI[0x53]._vptr_TPZSavable = 0;
  *(undefined4 *)((long)&in_RDI[0x53]._vptr_TPZSavable + 4) = 0;
  TPZAutoPointer<TPZStructMatrix>::TPZAutoPointer
            ((TPZAutoPointer<TPZStructMatrix> *)
             CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
             (TPZStructMatrix *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
  operator_new(0xd0);
  TPZSloanRenumbering::TPZSloanRenumbering(in_stack_fffffffffffffed0);
  TPZAutoPointer<TPZRenumbering>::TPZAutoPointer<TPZSloanRenumbering>
            ((TPZAutoPointer<TPZRenumbering> *)
             CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
             (TPZSloanRenumbering *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
  TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer
            ((TPZAutoPointer<TPZGuiInterface> *)
             CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
             (TPZGuiInterface *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
  TTablePostProcess::TTablePostProcess
            ((TTablePostProcess *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  SetCompMeshInit(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                  (bool)in_stack_fffffffffffffee7);
  return;
}

Assistant:

TPZAnalysis::TPZAnalysis(TPZCompMesh *mesh, bool mustOptimizeBandwidth, std::ostream &out) :
TPZRegisterClassId(&TPZAnalysis::ClassId),
fSolType(mesh->GetSolType()),
// fRhs(fSolType == EComplex ? true : false),
fSolution(fSolType == EComplex ? true : false),
fRenumber(new RENUMBER)
{
  //we must not call virtual methods in constructor
  this->SetCompMeshInit(mesh, mustOptimizeBandwidth);
}